

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5IndexRollback(Fts5Index *p)

{
  int extraout_EAX;
  
  fts5CloseReader(p);
  if (p->pHash != (Fts5Hash *)0x0) {
    sqlite3Fts5HashClear(p->pHash);
    p->nPendingData = 0;
  }
  fts5StructureInvalidate(p);
  return extraout_EAX;
}

Assistant:

static int sqlite3Fts5IndexRollback(Fts5Index *p){
  fts5CloseReader(p);
  fts5IndexDiscardData(p);
  fts5StructureInvalidate(p);
  /* assert( p->rc==SQLITE_OK ); */
  return SQLITE_OK;
}